

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

void __thiscall cubeb_auto_array_Test::TestBody(cubeb_auto_array_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Message *this_00;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  uint32_t i_5;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  uint32_t i_4;
  uint32_t j;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_13;
  uint32_t i_3;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  uint32_t *bb;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  uint32_t i_2;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  uint32_t b [10];
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  uint32_t i_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  uint32_t i;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  uint32_t a [10];
  auto_array<unsigned_int> array2;
  auto_array<unsigned_int> array;
  undefined7 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb5f;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  uint32_t in_stack_fffffffffffffb6c;
  auto_array<unsigned_int> *in_stack_fffffffffffffb70;
  auto_array<unsigned_int> *in_stack_fffffffffffffb78;
  AssertHelper local_478;
  Message local_470;
  undefined4 local_464;
  size_t local_460;
  AssertionResult local_458;
  AssertHelper local_448;
  Message local_440;
  int local_434;
  AssertionResult local_430;
  uint local_41c;
  AssertHelper local_418;
  Message local_410;
  undefined4 local_404;
  size_t local_400;
  AssertionResult local_3f8;
  AssertHelper local_3e8;
  Message local_3e0;
  undefined4 local_3d4;
  size_t local_3d0;
  AssertionResult local_3c8;
  AssertHelper local_3b8;
  Message local_3b0;
  AssertionResult local_3a8;
  uint local_398;
  uint local_394;
  String local_390;
  AssertHelper local_380;
  Message local_378;
  AssertionResult local_370;
  AssertHelper local_360;
  Message local_358;
  int local_34c;
  AssertionResult local_348;
  uint local_334;
  AssertHelper local_330;
  Message local_328;
  undefined4 local_31c;
  size_t local_318;
  AssertionResult local_310;
  AssertHelper local_300;
  Message local_2f8;
  undefined4 local_2ec;
  size_t local_2e8;
  AssertionResult local_2e0;
  undefined1 *local_2d0;
  AssertHelper local_2c8;
  Message local_2c0;
  int local_2b4;
  AssertionResult local_2b0;
  AssertHelper local_2a0;
  Message local_298;
  AssertionResult local_290;
  uint local_27c;
  AssertHelper local_278;
  Message local_270;
  undefined4 local_264;
  size_t local_260;
  AssertionResult local_258;
  AssertHelper local_248;
  Message local_240;
  undefined4 local_234;
  size_t local_230;
  AssertionResult local_228 [2];
  undefined1 auStack_204 [20];
  AssertHelper local_1f0;
  Message local_1e8;
  undefined4 local_1dc;
  size_t local_1d8;
  AssertionResult local_1d0;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined4 local_1ac;
  size_t local_1a8;
  AssertionResult local_1a0;
  AssertHelper local_190;
  Message local_188;
  AssertionResult local_180;
  uint local_16c;
  String local_168;
  AssertHelper local_158;
  Message local_150;
  AssertionResult local_148;
  AssertHelper local_138;
  Message local_130;
  undefined4 local_124;
  size_t local_120;
  AssertionResult local_118;
  AssertHelper local_108;
  Message local_100;
  undefined4 local_f4;
  size_t local_f0;
  AssertionResult local_e8;
  uint local_d4;
  AssertHelper local_d0;
  Message local_c8;
  undefined4 local_bc;
  size_t local_b8;
  AssertionResult local_b0;
  uint local_9c;
  AssertHelper local_98;
  Message local_90;
  undefined4 local_84;
  size_t local_80;
  AssertionResult local_78;
  uint local_68 [12];
  auto_array<unsigned_int> local_38;
  auto_array<unsigned_int> local_20;
  
  auto_array<unsigned_int>::auto_array(in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c);
  auto_array<unsigned_int>::auto_array(in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c);
  local_80 = auto_array<unsigned_int>::length(&local_38);
  local_84 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
            ((char *)in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
             (uint *)in_stack_fffffffffffffb60.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1070fa);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
               ,10,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message((Message *)0x10714a);
  }
  local_9c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10716f);
  if (local_9c == 0) {
    local_b8 = auto_array<unsigned_int>::capacity(&local_38);
    local_bc = 10;
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
              ((char *)in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (uint *)in_stack_fffffffffffffb60.ptr_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb70);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1071fa);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                 ,0xb,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      testing::Message::~Message((Message *)0x10724a);
    }
    local_9c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10726f);
    if (local_9c == 0) {
      for (local_d4 = 0; local_d4 < 10; local_d4 = local_d4 + 1) {
        local_68[local_d4] = local_d4;
      }
      local_f0 = auto_array<unsigned_int>::capacity(&local_20);
      local_f4 = 0;
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
                ((char *)in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70,
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                 (uint *)in_stack_fffffffffffffb60.ptr_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb70);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x107337);
        testing::internal::AssertHelper::AssertHelper
                  (&local_108,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                   ,0x12,pcVar2);
        testing::internal::AssertHelper::operator=(&local_108,&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_108);
        testing::Message::~Message((Message *)0x107387);
      }
      local_9c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1073ac);
      if (local_9c == 0) {
        local_120 = auto_array<unsigned_int>::length(&local_20);
        local_124 = 0;
        testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
                  ((char *)in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70,
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                   (uint *)in_stack_fffffffffffffb60.ptr_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffb70);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x107437);
          testing::internal::AssertHelper::AssertHelper
                    (&local_138,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                     ,0x13,pcVar2);
          testing::internal::AssertHelper::operator=(&local_138,&local_130);
          testing::internal::AssertHelper::~AssertHelper(&local_138);
          testing::Message::~Message((Message *)0x107487);
        }
        local_9c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1074ac);
        if (local_9c == 0) {
          auto_array<unsigned_int>::push
                    (in_stack_fffffffffffffb70,
                     (uint *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                     (size_t)in_stack_fffffffffffffb60.ptr_);
          auto_array<unsigned_int>::reserve
                    (in_stack_fffffffffffffb78,(size_t)in_stack_fffffffffffffb70);
          testing::AssertionResult::AssertionResult
                    ((AssertionResult *)in_stack_fffffffffffffb60.ptr_,
                     (bool)in_stack_fffffffffffffb5f);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffb70);
            testing::internal::GetBoolAssertionFailureMessage
                      ((internal *)&local_168,&local_148,"!array.reserve(9)","false","true");
            pcVar2 = testing::internal::String::c_str(&local_168);
            testing::internal::AssertHelper::AssertHelper
                      (&local_158,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                       ,0x17,pcVar2);
            testing::internal::AssertHelper::operator=(&local_158,&local_150);
            testing::internal::AssertHelper::~AssertHelper(&local_158);
            testing::internal::String::~String((String *)in_stack_fffffffffffffb60.ptr_);
            testing::Message::~Message((Message *)0x1075b7);
          }
          local_9c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1075dc);
          if (local_9c == 0) {
            for (local_16c = 0; local_16c < 10; local_16c = local_16c + 1) {
              auto_array<unsigned_int>::data(&local_20);
              testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                        ((char *)in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70,
                         (uint *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                         (uint *)in_stack_fffffffffffffb60.ptr_);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffb70);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x107676);
                testing::internal::AssertHelper::AssertHelper
                          (&local_190,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                           ,0x1a,pcVar2);
                testing::internal::AssertHelper::operator=(&local_190,&local_188);
                testing::internal::AssertHelper::~AssertHelper(&local_190);
                testing::Message::~Message((Message *)0x1076c6);
              }
              local_9c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x1076eb);
              if (local_9c != 0) goto LAB_00108839;
            }
            local_1a8 = auto_array<unsigned_int>::capacity(&local_20);
            local_1ac = 10;
            testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
                      ((char *)in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70,
                       (unsigned_long *)
                       CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                       (uint *)in_stack_fffffffffffffb60.ptr_);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a0);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffb70);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10778e);
              testing::internal::AssertHelper::AssertHelper
                        (&local_1c0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                         ,0x1d,pcVar2);
              testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
              testing::internal::AssertHelper::~AssertHelper(&local_1c0);
              testing::Message::~Message((Message *)0x1077de);
            }
            local_9c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x107803);
            if (local_9c == 0) {
              local_1d8 = auto_array<unsigned_int>::length(&local_20);
              local_1dc = 10;
              testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
                        ((char *)in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70,
                         (unsigned_long *)
                         CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                         (uint *)in_stack_fffffffffffffb60.ptr_);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d0);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffb70);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10788e);
                testing::internal::AssertHelper::AssertHelper
                          (&local_1f0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                           ,0x1e,pcVar2);
                testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
                testing::internal::AssertHelper::~AssertHelper(&local_1f0);
                testing::Message::~Message((Message *)0x1078de);
              }
              local_9c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x107903);
              if (local_9c == 0) {
                auto_array<unsigned_int>::pop
                          ((auto_array<unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                           (uint *)in_stack_fffffffffffffb60.ptr_,
                           CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58));
                local_230 = auto_array<unsigned_int>::capacity(&local_20);
                local_234 = 10;
                testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
                          ((char *)in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70,
                           (unsigned_long *)
                           CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                           (uint *)in_stack_fffffffffffffb60.ptr_);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_228);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffb70);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1079a8);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_248,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                             ,0x24,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_248,&local_240);
                  testing::internal::AssertHelper::~AssertHelper(&local_248);
                  testing::Message::~Message((Message *)0x1079f8);
                }
                local_9c = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x107a1d);
                if (local_9c == 0) {
                  local_260 = auto_array<unsigned_int>::length(&local_20);
                  local_264 = 5;
                  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
                            ((char *)in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70,
                             (unsigned_long *)
                             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                             (uint *)in_stack_fffffffffffffb60.ptr_);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_258);
                  if (!bVar1) {
                    testing::Message::Message((Message *)in_stack_fffffffffffffb70);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x107aa8);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_278,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                               ,0x25,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_278,&local_270);
                    testing::internal::AssertHelper::~AssertHelper(&local_278);
                    testing::Message::~Message((Message *)0x107af8);
                  }
                  local_9c = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x107b1d);
                  if (local_9c == 0) {
                    for (local_27c = 0; local_27c < 5; local_27c = local_27c + 1) {
                      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                                ((char *)in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70
                                 ,(uint *)CONCAT44(in_stack_fffffffffffffb6c,
                                                   in_stack_fffffffffffffb68),
                                 (uint *)in_stack_fffffffffffffb60.ptr_);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_290);
                      if (!bVar1) {
                        testing::Message::Message((Message *)in_stack_fffffffffffffb70);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)0x107baf);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_2a0,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                                   ,0x27,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
                        testing::internal::AssertHelper::~AssertHelper(&local_2a0);
                        testing::Message::~Message((Message *)0x107bff);
                      }
                      local_9c = (uint)!bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)0x107c24);
                      if (local_9c != 0) goto LAB_00108839;
                      auto_array<unsigned_int>::data(&local_20);
                      local_2b4 = local_27c + 5;
                      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                                ((char *)in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70
                                 ,(uint *)CONCAT44(in_stack_fffffffffffffb6c,
                                                   in_stack_fffffffffffffb68),
                                 (uint *)in_stack_fffffffffffffb60.ptr_);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b0);
                      if (!bVar1) {
                        testing::Message::Message((Message *)in_stack_fffffffffffffb70);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)0x107cb6);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_2c8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                                   ,0x28,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
                        testing::internal::AssertHelper::~AssertHelper(&local_2c8);
                        testing::Message::~Message((Message *)0x107d06);
                      }
                      local_9c = (uint)!bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)0x107d2b);
                      if (local_9c != 0) goto LAB_00108839;
                    }
                    local_2d0 = auStack_204;
                    auto_array<unsigned_int>::pop
                              ((auto_array<unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                               (uint *)in_stack_fffffffffffffb60.ptr_,
                               CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58));
                    local_2e8 = auto_array<unsigned_int>::capacity(&local_20);
                    local_2ec = 10;
                    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
                              ((char *)in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70,
                               (unsigned_long *)
                               CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                               (uint *)in_stack_fffffffffffffb60.ptr_);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
                    if (!bVar1) {
                      testing::Message::Message((Message *)in_stack_fffffffffffffb70);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)0x107dfc);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_300,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                                 ,0x2d,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
                      testing::internal::AssertHelper::~AssertHelper(&local_300);
                      testing::Message::~Message((Message *)0x107e4c);
                    }
                    local_9c = (uint)!bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0x107e71);
                    if (local_9c == 0) {
                      local_318 = auto_array<unsigned_int>::length(&local_20);
                      local_31c = 0;
                      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
                                ((char *)in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70
                                 ,(unsigned_long *)
                                  CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                                 (uint *)in_stack_fffffffffffffb60.ptr_);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_310);
                      if (!bVar1) {
                        testing::Message::Message((Message *)in_stack_fffffffffffffb70);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)0x107efc);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_330,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                                   ,0x2e,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_330,&local_328);
                        testing::internal::AssertHelper::~AssertHelper(&local_330);
                        testing::Message::~Message((Message *)0x107f4c);
                      }
                      local_9c = (uint)!bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)0x107f71);
                      if (local_9c == 0) {
                        for (local_334 = 0; local_334 < 5; local_334 = local_334 + 1) {
                          local_34c = local_334 + 5;
                          testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                                    ((char *)in_stack_fffffffffffffb78,
                                     (char *)in_stack_fffffffffffffb70,
                                     (uint *)CONCAT44(in_stack_fffffffffffffb6c,
                                                      in_stack_fffffffffffffb68),
                                     (uint *)in_stack_fffffffffffffb60.ptr_);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_348);
                          if (!bVar1) {
                            testing::Message::Message((Message *)in_stack_fffffffffffffb70);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)0x108014);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_360,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                                       ,0x30,pcVar2);
                            testing::internal::AssertHelper::operator=(&local_360,&local_358);
                            testing::internal::AssertHelper::~AssertHelper(&local_360);
                            testing::Message::~Message((Message *)0x108064);
                          }
                          local_9c = (uint)!bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)0x108089);
                          if (local_9c != 0) goto LAB_00108839;
                        }
                        auto_array<unsigned_int>::pop
                                  ((auto_array<unsigned_int> *)
                                   CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                                   (uint *)in_stack_fffffffffffffb60.ptr_,
                                   CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58));
                        testing::AssertionResult::AssertionResult
                                  ((AssertionResult *)in_stack_fffffffffffffb60.ptr_,
                                   (bool)in_stack_fffffffffffffb5f);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_370);
                        if (!bVar1) {
                          testing::Message::Message((Message *)in_stack_fffffffffffffb70);
                          testing::internal::GetBoolAssertionFailureMessage
                                    ((internal *)&local_390,&local_370,"!array.pop(nullptr, 1)",
                                     "false","true");
                          pcVar2 = testing::internal::String::c_str(&local_390);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_380,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                                     ,0x33,pcVar2);
                          testing::internal::AssertHelper::operator=(&local_380,&local_378);
                          testing::internal::AssertHelper::~AssertHelper(&local_380);
                          testing::internal::String::~String
                                    ((String *)in_stack_fffffffffffffb60.ptr_);
                          testing::Message::~Message((Message *)0x108196);
                        }
                        local_9c = (uint)!bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1081bb);
                        if (local_9c == 0) {
                          auto_array<unsigned_int>::push
                                    (in_stack_fffffffffffffb70,
                                     (uint *)CONCAT44(in_stack_fffffffffffffb6c,
                                                      in_stack_fffffffffffffb68),
                                     (size_t)in_stack_fffffffffffffb60.ptr_);
                          auto_array<unsigned_int>::push
                                    (in_stack_fffffffffffffb70,
                                     (uint *)CONCAT44(in_stack_fffffffffffffb6c,
                                                      in_stack_fffffffffffffb68),
                                     (size_t)in_stack_fffffffffffffb60.ptr_);
                          for (local_394 = 0; local_394 < 2; local_394 = local_394 + 1) {
                            for (local_398 = 0; local_398 < 10; local_398 = local_398 + 1) {
                              auto_array<unsigned_int>::data(&local_20);
                              testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                                        ((char *)in_stack_fffffffffffffb78,
                                         (char *)in_stack_fffffffffffffb70,
                                         (uint *)CONCAT44(in_stack_fffffffffffffb6c,
                                                          in_stack_fffffffffffffb68),
                                         (uint *)in_stack_fffffffffffffb60.ptr_);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
                              if (!bVar1) {
                                testing::Message::Message((Message *)in_stack_fffffffffffffb70);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)0x1082ac);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_3b8,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                                           ,0x3a,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
                                testing::internal::AssertHelper::~AssertHelper(&local_3b8);
                                testing::Message::~Message((Message *)0x1082fc);
                              }
                              local_9c = (uint)!bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)0x108321);
                              if (local_9c != 0) goto LAB_00108839;
                            }
                          }
                          local_3d0 = auto_array<unsigned_int>::length(&local_20);
                          local_3d4 = 0x14;
                          testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
                                    ((char *)in_stack_fffffffffffffb78,
                                     (char *)in_stack_fffffffffffffb70,
                                     (unsigned_long *)
                                     CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                                     (uint *)in_stack_fffffffffffffb60.ptr_);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c8);
                          if (!bVar1) {
                            testing::Message::Message((Message *)in_stack_fffffffffffffb70);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)0x1083dc);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_3e8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                                       ,0x3d,pcVar2);
                            testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
                            testing::internal::AssertHelper::~AssertHelper(&local_3e8);
                            testing::Message::~Message((Message *)0x10842c);
                          }
                          local_9c = (uint)!bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)0x108451);
                          if (local_9c == 0) {
                            local_400 = auto_array<unsigned_int>::capacity(&local_20);
                            local_404 = 0x14;
                            testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
                                      ((char *)in_stack_fffffffffffffb78,
                                       (char *)in_stack_fffffffffffffb70,
                                       (unsigned_long *)
                                       CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)
                                       ,(uint *)in_stack_fffffffffffffb60.ptr_);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
                            if (!bVar1) {
                              testing::Message::Message((Message *)in_stack_fffffffffffffb70);
                              pcVar2 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)0x1084dc);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_418,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                                         ,0x3e,pcVar2);
                              testing::internal::AssertHelper::operator=(&local_418,&local_410);
                              testing::internal::AssertHelper::~AssertHelper(&local_418);
                              testing::Message::~Message((Message *)0x10852c);
                            }
                            local_9c = (uint)!bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)0x108551);
                            if (local_9c == 0) {
                              auto_array<unsigned_int>::pop
                                        ((auto_array<unsigned_int> *)
                                         CONCAT44(in_stack_fffffffffffffb6c,
                                                  in_stack_fffffffffffffb68),
                                         (uint *)in_stack_fffffffffffffb60.ptr_,
                                         CONCAT17(in_stack_fffffffffffffb5f,
                                                  in_stack_fffffffffffffb58));
                              for (local_41c = 0; local_41c < 5; local_41c = local_41c + 1) {
                                auto_array<unsigned_int>::data(&local_20);
                                local_434 = local_41c + 5;
                                testing::internal::EqHelper<false>::
                                Compare<unsigned_int,unsigned_int>
                                          ((char *)in_stack_fffffffffffffb78,
                                           (char *)in_stack_fffffffffffffb70,
                                           (uint *)CONCAT44(in_stack_fffffffffffffb6c,
                                                            in_stack_fffffffffffffb68),
                                           (uint *)in_stack_fffffffffffffb60.ptr_);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_430);
                                if (!bVar1) {
                                  testing::Message::Message((Message *)in_stack_fffffffffffffb70);
                                  pcVar2 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)0x108600);
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_448,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                                             ,0x42,pcVar2);
                                  testing::internal::AssertHelper::operator=(&local_448,&local_440);
                                  testing::internal::AssertHelper::~AssertHelper(&local_448);
                                  testing::Message::~Message((Message *)0x108641);
                                }
                                local_9c = (uint)!bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)0x108663);
                                if (local_9c != 0) goto LAB_00108839;
                              }
                              local_460 = auto_array<unsigned_int>::length(&local_20);
                              local_464 = 0xf;
                              testing::internal::EqHelper<false>::
                              Compare<unsigned_long,unsigned_int>
                                        ((char *)in_stack_fffffffffffffb78,
                                         (char *)in_stack_fffffffffffffb70,
                                         (unsigned_long *)
                                         CONCAT44(in_stack_fffffffffffffb6c,
                                                  in_stack_fffffffffffffb68),
                                         (uint *)in_stack_fffffffffffffb60.ptr_);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_458);
                              if (!bVar1) {
                                testing::Message::Message((Message *)in_stack_fffffffffffffb70);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)0x1086ee);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_478,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                                           ,0x45,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_478,&local_470);
                                testing::internal::AssertHelper::~AssertHelper(&local_478);
                                testing::Message::~Message((Message *)0x10872f);
                              }
                              local_9c = (uint)!bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)0x108751);
                              if (local_9c == 0) {
                                this_00 = (Message *)auto_array<unsigned_int>::capacity(&local_20);
                                testing::internal::EqHelper<false>::
                                Compare<unsigned_long,unsigned_int>
                                          ((char *)in_stack_fffffffffffffb78,(char *)this_00,
                                           (unsigned_long *)CONCAT44(0x14,in_stack_fffffffffffffb68)
                                           ,(uint *)in_stack_fffffffffffffb60.ptr_);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)&stack0xfffffffffffffb78);
                                if (!bVar1) {
                                  testing::Message::Message(this_00);
                                  pcVar2 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)0x1087c4);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&stack0xfffffffffffffb58,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_utils.cpp"
                                             ,0x46,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&stack0xfffffffffffffb58,
                                             (Message *)&stack0xfffffffffffffb60);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&stack0xfffffffffffffb58);
                                  testing::Message::~Message((Message *)0x1087ff);
                                }
                                local_9c = (uint)!bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)0x108821);
                                if (local_9c == 0) {
                                  local_9c = 0;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00108839:
  auto_array<unsigned_int>::~auto_array((auto_array<unsigned_int> *)in_stack_fffffffffffffb60.ptr_);
  auto_array<unsigned_int>::~auto_array((auto_array<unsigned_int> *)in_stack_fffffffffffffb60.ptr_);
  return;
}

Assistant:

TEST(cubeb, auto_array)
{
  auto_array<uint32_t> array;
  auto_array<uint32_t> array2(10);
  uint32_t a[10];

  ASSERT_EQ(array2.length(), 0u);
  ASSERT_EQ(array2.capacity(), 10u);


  for (uint32_t i = 0; i < 10; i++) {
    a[i] = i;
  }

  ASSERT_EQ(array.capacity(), 0u);
  ASSERT_EQ(array.length(), 0u);

  array.push(a, 10);

  ASSERT_TRUE(!array.reserve(9));

  for (uint32_t i = 0; i < 10; i++) {
    ASSERT_EQ(array.data()[i], i);
  }

  ASSERT_EQ(array.capacity(), 10u);
  ASSERT_EQ(array.length(), 10u);

  uint32_t b[10];

  array.pop(b, 5);

  ASSERT_EQ(array.capacity(), 10u);
  ASSERT_EQ(array.length(), 5u);
  for (uint32_t i = 0; i < 5; i++) {
    ASSERT_EQ(b[i], i);
    ASSERT_EQ(array.data()[i], 5 + i);
  }
  uint32_t* bb = b + 5;
  array.pop(bb, 5);

  ASSERT_EQ(array.capacity(), 10u);
  ASSERT_EQ(array.length(), 0u);
  for (uint32_t i = 0; i < 5; i++) {
    ASSERT_EQ(bb[i], 5 + i);
  }

  ASSERT_TRUE(!array.pop(nullptr, 1));

  array.push(a, 10);
  array.push(a, 10);

  for (uint32_t j = 0; j < 2; j++) {
    for (uint32_t i = 0; i < 10; i++) {
      ASSERT_EQ(array.data()[10 * j + i], i);
    }
  }
  ASSERT_EQ(array.length(), 20u);
  ASSERT_EQ(array.capacity(), 20u);
  array.pop(nullptr, 5);

  for (uint32_t i = 0; i < 5; i++) {
    ASSERT_EQ(array.data()[i], 5 + i);
  }

  ASSERT_EQ(array.length(), 15u);
  ASSERT_EQ(array.capacity(), 20u);
}